

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O3

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantArithmetic
          (LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  Instruction *pIVar3;
  PSNode *pPVar4;
  pointer ppPVar5;
  PSNodesSeq *pPVar6;
  byte bVar7;
  long lVar8;
  Value *val;
  Pointer PVar9;
  
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    pIVar3 = Inst + -(ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    pIVar3 = *(Instruction **)(Inst + -8);
  }
  val = *(Value **)pIVar3;
  if (val[0x10] == (Value)0x10) {
    val = *(Value **)(pIVar3 + 0x20);
LAB_0011e02b:
    pPVar4 = getOperand(this,val);
  }
  else {
    if (*(char *)(*(long *)(pIVar3 + 0x20) + 0x10) == '\x10') goto LAB_0011e02b;
    pPVar4 = tryGetOperand(this,val);
    if (pPVar4 == (PSNode *)0x0) {
      if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
        lVar8 = (long)Inst - (ulong)(*(uint *)(Inst + 0x14) << 5);
      }
      else {
        lVar8 = *(long *)(Inst + -8);
      }
      pPVar4 = tryGetOperand(this,*(Value **)(lVar8 + 0x20));
      if (pPVar4 == (PSNode *)0x0) {
        pPVar6 = createUnknown(this,(Value *)Inst);
        ppPVar5 = (pPVar6->_nodes).
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        goto LAB_0011e085;
      }
    }
  }
  p_Var1 = (pPVar4->pointsTo).pointers._bits.
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h._M_before_begin._M_nxt;
  if (((pPVar4->pointsTo).pointers._bits.
       super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
       .
       super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ._M_h._M_element_count == 0) || (p_Var2 = p_Var1[2]._M_nxt, ((ulong)p_Var2 & 1) != 0)) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      if (lVar8 == 0x3f) {
        lVar8 = 0x40;
        break;
      }
      bVar7 = (byte)lVar8;
      lVar8 = lVar8 + 1;
    } while (((ulong)p_Var2 >> (bVar7 & 0x3f) & 2) == 0);
  }
  ppPVar5 = (pointer)((long)p_Var1[1]._M_nxt * 0x10 + lVar8 * 0x10 + _setEntry + -0x10);
LAB_0011e085:
  PVar9.offset.offset = Offset::UNKNOWN.offset;
  PVar9.target = *ppPVar5;
  return PVar9;
}

Assistant:

Pointer LLVMPointerGraphBuilder::handleConstantArithmetic(
        const llvm::Instruction *Inst) {
    using namespace llvm;

    PSNode *op;

    if (isa<ConstantInt>(Inst->getOperand(0))) {
        op = getOperand(Inst->getOperand(1));
    } else if (isa<ConstantInt>(Inst->getOperand(1))) {
        op = getOperand(Inst->getOperand(0));
    } else {
        op = tryGetOperand(Inst->getOperand(0));
        if (!op)
            op = tryGetOperand(Inst->getOperand(1));

        if (!op)
            return Pointer{createUnknown(Inst).getSingleNode(),
                           Offset::UNKNOWN};
    }

    assert(op && "Don't have operand for add");
    assert(op->pointsTo.size() == 1 &&
           "Constant add with not only one pointer");

    Pointer ptr = *op->pointsTo.begin();
    return {ptr.target, Offset::UNKNOWN};
}